

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O3

char * google::protobuf::internal::
       WireFormatParser<google::protobuf::internal::UnknownFieldParserHelper>
                 (UnknownFieldParserHelper *field_parser,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  bool bVar2;
  uint res;
  byte *ptr_00;
  pair<const_char_*,_unsigned_int> pVar3;
  byte *local_20;
  
  local_20 = (byte *)ptr;
  while( true ) {
    bVar2 = EpsCopyInputStream::DoneWithCheck<false>
                      (&ctx->super_EpsCopyInputStream,(char **)&local_20,ctx->group_depth_);
    if (bVar2) {
      return (char *)local_20;
    }
    bVar1 = *local_20;
    res = (uint)bVar1;
    ptr_00 = local_20 + 1;
    if ((char)bVar1 < '\0') {
      res = ((uint)bVar1 + (uint)*ptr_00 * 0x80) - 0x80;
      if ((char)*ptr_00 < '\0') {
        pVar3 = ReadTagFallback((char *)local_20,res);
        res = pVar3.second;
        ptr_00 = (byte *)pVar3.first;
        if (ptr_00 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
      else {
        ptr_00 = local_20 + 2;
      }
    }
    if ((res == 0) || ((res & 7) == 4)) break;
    local_20 = ptr_00;
    local_20 = (byte *)FieldParser<google::protobuf::internal::UnknownFieldParserHelper>
                                 ((ulong)res,field_parser,(char *)ptr_00,ctx);
    if (local_20 == (byte *)0x0) {
      return (char *)0x0;
    }
  }
  (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
  return (char *)ptr_00;
}

Assistant:

[[nodiscard]] const char* WireFormatParser(T& field_parser, const char* ptr,
                                           ParseContext* ctx) {
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ReadTag(ptr, &tag);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
    if (tag == 0 || (tag & 7) == 4) {
      ctx->SetLastTag(tag);
      return ptr;
    }
    ptr = FieldParser(tag, field_parser, ptr, ctx);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
  }
  return ptr;
}